

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::DebugOutStream::DebugOutStream(DebugOutStream *this)

{
  StreamBufImpl<Catch::OutputDebugWriter,_256UL> *this_00;
  
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__DebugOutStream_001bfaa0;
  this_00 = (StreamBufImpl<Catch::OutputDebugWriter,_256UL> *)operator_new(0x148);
  StreamBufImpl<Catch::OutputDebugWriter,_256UL>::StreamBufImpl(this_00);
  (this->m_streamBuf)._M_t.
  super___uniq_ptr_impl<Catch::StreamBufBase,_std::default_delete<Catch::StreamBufBase>_>._M_t.
  super__Tuple_impl<0UL,_Catch::StreamBufBase_*,_std::default_delete<Catch::StreamBufBase>_>.
  super__Head_base<0UL,_Catch::StreamBufBase_*,_false>._M_head_impl = (StreamBufBase *)this_00;
  std::ostream::ostream(&this->m_os,(streambuf *)this_00);
  return;
}

Assistant:

DebugOutStream::DebugOutStream()
    :   m_streamBuf( new StreamBufImpl<OutputDebugWriter>() ),
        m_os( m_streamBuf.get() )
    {}